

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

void X509V3_set_ctx(X509V3_CTX *ctx,X509 *issuer,X509 *subject,X509_REQ *req,X509_CRL *crl,int flags
                   )

{
  int flags_local;
  X509_CRL *crl_local;
  X509_REQ *req_local;
  X509 *subj_local;
  X509 *issuer_local;
  X509V3_CTX *ctx_local;
  
  OPENSSL_memset(ctx,0,0x30);
  ctx->issuer_cert = issuer;
  ctx->subject_cert = subject;
  ctx->crl = crl;
  ctx->subject_req = req;
  ctx->flags = flags;
  return;
}

Assistant:

void X509V3_set_ctx(X509V3_CTX *ctx, const X509 *issuer, const X509 *subj,
                    const X509_REQ *req, const X509_CRL *crl, int flags) {
  OPENSSL_memset(ctx, 0, sizeof(*ctx));
  ctx->issuer_cert = issuer;
  ctx->subject_cert = subj;
  ctx->crl = crl;
  ctx->subject_req = req;
  ctx->flags = flags;
}